

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

bool GetAuthCookie(string *cookie_out)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  path filepath;
  string cookie;
  ifstream file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::ifstream::ifstream(&file);
  cookie._M_dataplus._M_p = (pointer)&cookie.field_2;
  cookie._M_string_length = 0;
  cookie.field_2._M_local_buf[0] = '\0';
  GetAuthCookieFile(&filepath,false);
  std::ifstream::open((char *)&file,(_Ios_Openmode)filepath.super_path._M_pathname._M_dataplus._M_p)
  ;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&file,(string *)&cookie);
    std::ifstream::close();
    if (cookie_out != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (cookie_out,&cookie);
    }
  }
  std::filesystem::__cxx11::path::~path(&filepath.super_path);
  std::__cxx11::string::~string((string *)&cookie);
  std::ifstream::~ifstream(&file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool GetAuthCookie(std::string *cookie_out)
{
    std::ifstream file;
    std::string cookie;
    fs::path filepath = GetAuthCookieFile();
    file.open(filepath);
    if (!file.is_open())
        return false;
    std::getline(file, cookie);
    file.close();

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}